

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

RPCHelpMan * getrpcinfo(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong *puVar2;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  long lVar4;
  RPCHelpMan *in_RDI;
  undefined8 uVar5;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  undefined8 in_stack_fffffffffffff8b8;
  undefined8 in_stack_fffffffffffff8c8;
  undefined8 in_stack_fffffffffffff8d0;
  undefined8 in_stack_fffffffffffff8d8;
  code *pcVar6;
  undefined8 in_stack_fffffffffffff8e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff8e8;
  pointer in_stack_fffffffffffff8f8;
  pointer pRVar7;
  pointer in_stack_fffffffffffff900;
  pointer pRVar8;
  pointer in_stack_fffffffffffff908;
  pointer pRVar9;
  undefined8 in_stack_fffffffffffff910;
  pointer pRVar10;
  pointer pRVar11;
  pointer pRVar12;
  undefined8 in_stack_fffffffffffff930;
  pointer pRVar13;
  pointer pRVar14;
  vector<RPCResult,_std::allocator<RPCResult>_> local_6a8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_690;
  vector<RPCResult,_std::allocator<RPCResult>_> local_678;
  RPCResults local_660;
  vector<RPCArg,_std::allocator<RPCArg>_> local_648;
  string local_628;
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  string local_588;
  ulong *local_568;
  undefined8 local_560;
  ulong local_558;
  undefined8 uStack_550;
  ulong *local_548;
  size_type local_540;
  ulong local_538;
  undefined8 uStack_530;
  long *local_528 [2];
  long local_518 [2];
  long *local_508 [2];
  long local_4f8 [2];
  long *local_4e8 [2];
  long local_4d8 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_4c8;
  long *local_4a8 [2];
  long local_498 [2];
  pointer local_488 [2];
  undefined1 local_478 [152];
  RPCResult local_3e0;
  long *local_358 [2];
  long local_348 [2];
  long *local_338 [2];
  long local_328 [2];
  undefined1 local_318 [120];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  long *local_290 [2];
  long local_280 [2];
  long *local_270 [2];
  long local_260 [2];
  RPCResult local_250;
  RPCResult local_1c8;
  long *local_140 [2];
  long local_130 [2];
  long *local_120 [2];
  long local_110 [2];
  RPCResult local_100;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"getrpcinfo","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"\nReturns details of the RPC server.\n","");
  local_120[0] = local_110;
  local_648.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_648.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_648.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"");
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"");
  local_270[0] = local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"active_commands","");
  local_290[0] = local_280;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"All active commands","");
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"");
  local_358[0] = local_348;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_358,"Information about an active command","");
  local_488[0] = (pointer)local_478;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"method","");
  local_4a8[0] = local_498;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4a8,"The name of the RPC command","");
  pRVar13 = (pointer)0x0;
  pRVar14 = (pointer)0x0;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8b8;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff8c8;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff8d0;
  description._M_string_length = in_stack_fffffffffffff8e0;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8d8;
  description.field_2 = in_stack_fffffffffffff8e8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff900;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff8f8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff908;
  RPCResult::RPCResult
            ((RPCResult *)(local_478 + 0x10),STR,m_key_name,description,inner,SUB81(local_488,0));
  local_4c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_4c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"duration","");
  local_4e8[0] = local_4d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4e8,"The running time in microseconds","");
  pRVar10 = (pointer)0x0;
  pRVar11 = (pointer)0x0;
  pRVar12 = (pointer)0x0;
  m_key_name_00._M_string_length = (size_type)in_RDI;
  m_key_name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8b8;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff8c8;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff8d0;
  description_00._M_string_length = in_stack_fffffffffffff8e0;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8d8;
  description_00.field_2._M_local_buf = in_stack_fffffffffffff8e8._M_local_buf;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff900;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff8f8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff908;
  RPCResult::RPCResult(&local_3e0,NUM,m_key_name_00,description_00,inner_00,SUB81(&local_4c8,0));
  __l._M_len = 2;
  __l._M_array = (iterator)(local_478 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_6a8,__l,(allocator_type *)&stack0xfffffffffffff917);
  m_key_name_01._M_string_length = (size_type)in_RDI;
  m_key_name_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8b8;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff8c8;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff8d0;
  description_01._M_string_length = in_stack_fffffffffffff8e0;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8d8;
  description_01.field_2 = in_stack_fffffffffffff8e8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff900;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff8f8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff908;
  RPCResult::RPCResult
            ((RPCResult *)local_318,OBJ,m_key_name_01,description_01,inner_01,SUB81(local_338,0));
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_318;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_690,__l_00,(allocator_type *)&stack0xfffffffffffff916);
  m_key_name_02._M_string_length = (size_type)in_RDI;
  m_key_name_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8b8;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffff8c8;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffff8d0;
  description_02._M_string_length = in_stack_fffffffffffff8e0;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8d8;
  description_02.field_2 = in_stack_fffffffffffff8e8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff900;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff8f8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff908;
  RPCResult::RPCResult(&local_250,ARR,m_key_name_02,description_02,inner_02,SUB81(local_270,0));
  local_508[0] = local_4f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_508,"logpath","");
  local_528[0] = local_518;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_528,"The complete file path to the debug log","");
  pRVar7 = (pointer)0x0;
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  m_key_name_03._M_string_length = (size_type)in_RDI;
  m_key_name_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8b8;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_fffffffffffff8c8;
  m_key_name_03.field_2._8_8_ = in_stack_fffffffffffff8d0;
  description_03._M_string_length = in_stack_fffffffffffff8e0;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8d8;
  description_03.field_2._M_local_buf = in_stack_fffffffffffff8e8._M_local_buf;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_1c8,STR,m_key_name_03,description_03,inner_03,SUB81(local_508,0));
  __l_01._M_len = 2;
  __l_01._M_array = &local_250;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_678,__l_01,(allocator_type *)&stack0xfffffffffffff8f7);
  m_key_name_04._M_string_length = (size_type)in_RDI;
  m_key_name_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8b8;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_fffffffffffff8c8;
  m_key_name_04.field_2._8_8_ = in_stack_fffffffffffff8d0;
  description_04._M_string_length = in_stack_fffffffffffff8e0;
  description_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8d8;
  description_04.field_2 = in_stack_fffffffffffff8e8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar7;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar9;
  RPCResult::RPCResult(&local_100,OBJ,m_key_name_04,description_04,inner_04,SUB81(local_120,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result._0_8_ = in_stack_fffffffffffff8b8;
  result.m_key_name._M_string_length = in_stack_fffffffffffff8c8;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff8d0;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff8d8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff8e0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff8e8;
  result._64_8_ = pRVar7;
  result.m_description._M_dataplus._M_p = (pointer)pRVar8;
  result.m_description._M_string_length = (size_type)pRVar9;
  result.m_description.field_2._M_allocated_capacity = in_stack_fffffffffffff910;
  result.m_description.field_2._8_8_ = pRVar10;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar11;
  result.m_cond._M_string_length = (size_type)pRVar12;
  result.m_cond.field_2._M_allocated_capacity = in_stack_fffffffffffff930;
  result.m_cond.field_2._8_8_ = pRVar13;
  RPCResults::RPCResults(&local_660,result);
  local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"getrpcinfo","");
  local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8,"");
  HelpExampleCli(&local_588,&local_5a8,&local_5c8);
  local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_608,"getrpcinfo","");
  local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"");
  HelpExampleRpc(&local_5e8,&local_608,&local_628);
  uVar5 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != &local_588.field_2) {
    uVar5 = local_588.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar5 < local_5e8._M_string_length + local_588._M_string_length) {
    uVar5 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
      uVar5 = local_5e8.field_2._M_allocated_capacity;
    }
    if (local_5e8._M_string_length + local_588._M_string_length <= (ulong)uVar5) {
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_5e8,0,0,local_588._M_dataplus._M_p,local_588._M_string_length);
      goto LAB_00aa79e5;
    }
  }
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_588,local_5e8._M_dataplus._M_p,local_5e8._M_string_length);
LAB_00aa79e5:
  local_568 = &local_558;
  puVar2 = (ulong *)(pbVar3->_M_dataplus)._M_p;
  paVar1 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == paVar1) {
    local_558 = paVar1->_M_allocated_capacity;
    uStack_550 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_558 = paVar1->_M_allocated_capacity;
    local_568 = puVar2;
  }
  local_540 = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar3->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if (local_568 == &local_558) {
    uStack_530 = uStack_550;
    local_548 = &local_538;
  }
  else {
    local_548 = local_568;
  }
  local_538 = local_558;
  local_560 = 0;
  local_558 = local_558 & 0xffffffffffffff00;
  pcVar6 = std::
           _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/server.cpp:238:9)>
           ::_M_manager;
  description_05._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/server.cpp:238:9)>
       ::_M_invoke;
  description_05._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/server.cpp:238:9)>
                ::_M_manager;
  description_05.field_2 = in_stack_fffffffffffff8e8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar7;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar9;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar10;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff910;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar11;
  examples.m_examples._M_string_length = in_stack_fffffffffffff930;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar12;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar13;
  examples.m_examples.field_2._8_8_ = pRVar14;
  local_568 = &local_558;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xfffffffffffff8c8)),description_05,args,
             results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar6 != (code *)0x0) {
    (*pcVar6)(&stack0xfffffffffffff8c8,&stack0xfffffffffffff8c8,3);
  }
  if (local_548 != &local_538) {
    operator_delete(local_548,local_538 + 1);
  }
  if (local_568 != &local_558) {
    operator_delete(local_568,local_558 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
    operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_628._M_dataplus._M_p != &local_628.field_2) {
    operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608._M_dataplus._M_p != &local_608.field_2) {
    operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != &local_588.field_2) {
    operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
    operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
    operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_660.m_results);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_cond._M_dataplus._M_p != &local_100.m_cond.field_2) {
    operator_delete(local_100.m_cond._M_dataplus._M_p,
                    local_100.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_description._M_dataplus._M_p != &local_100.m_description.field_2) {
    operator_delete(local_100.m_description._M_dataplus._M_p,
                    local_100.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_100.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_key_name._M_dataplus._M_p != &local_100.m_key_name.field_2) {
    operator_delete(local_100.m_key_name._M_dataplus._M_p,
                    local_100.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_678);
  lVar4 = 0x110;
  do {
    if ((long *)((long)local_260 + lVar4) != *(long **)((long)local_270 + lVar4)) {
      operator_delete(*(long **)((long)local_270 + lVar4),*(long *)((long)local_260 + lVar4) + 1);
    }
    if ((long *)((long)local_280 + lVar4) != *(long **)((long)local_290 + lVar4)) {
      operator_delete(*(long **)((long)local_290 + lVar4),*(long *)((long)local_280 + lVar4) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)(local_318 + lVar4 + 0x68));
    if ((long *)(local_318 + lVar4 + 0x58) != *(long **)(local_318 + lVar4 + 0x48)) {
      operator_delete(*(long **)(local_318 + lVar4 + 0x48),*(long *)(local_318 + lVar4 + 0x58) + 1);
    }
    lVar4 = lVar4 + -0x88;
  } while (lVar4 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff8f8);
  if (local_528[0] != local_518) {
    operator_delete(local_528[0],local_518[0] + 1);
  }
  if (local_508[0] != local_4f8) {
    operator_delete(local_508[0],local_4f8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_690);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._104_8_ != &local_2a0) {
    operator_delete((void *)local_318._104_8_,local_2a0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_318._72_8_ != local_318 + 0x58) {
    operator_delete((void *)local_318._72_8_,local_318._88_8_ + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)(local_318 + 0x28));
  if ((undefined1 *)local_318._8_8_ != local_318 + 0x18) {
    operator_delete((void *)local_318._8_8_,local_318._24_8_ + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_6a8);
  lVar4 = 0x110;
  do {
    if ((long *)(local_478 + lVar4) != *(long **)((long)local_488 + lVar4)) {
      operator_delete(*(long **)((long)local_488 + lVar4),*(long *)(local_478 + lVar4) + 1);
    }
    if ((long *)((long)local_498 + lVar4) != *(long **)((long)local_4a8 + lVar4)) {
      operator_delete(*(long **)((long)local_4a8 + lVar4),*(long *)((long)local_498 + lVar4) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_4c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar4));
    if ((long *)((long)local_4d8 + lVar4) != *(long **)((long)local_4e8 + lVar4)) {
      operator_delete(*(long **)((long)local_4e8 + lVar4),*(long *)((long)local_4d8 + lVar4) + 1);
    }
    lVar4 = lVar4 + -0x88;
  } while (lVar4 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff918);
  if (local_4e8[0] != local_4d8) {
    operator_delete(local_4e8[0],local_4d8[0] + 1);
  }
  if (local_4c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_4c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_4c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_4c8.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff938);
  if (local_4a8[0] != local_498) {
    operator_delete(local_4a8[0],local_498[0] + 1);
  }
  if (local_488[0] != (pointer)local_478) {
    operator_delete(local_488[0],local_478._0_8_ + 1);
  }
  if (local_358[0] != local_348) {
    operator_delete(local_358[0],local_348[0] + 1);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if (local_290[0] != local_280) {
    operator_delete(local_290[0],local_280[0] + 1);
  }
  if (local_270[0] != local_260) {
    operator_delete(local_270[0],local_260[0] + 1);
  }
  if (local_140[0] != local_130) {
    operator_delete(local_140[0],local_130[0] + 1);
  }
  if (local_120[0] != local_110) {
    operator_delete(local_120[0],local_110[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_648);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getrpcinfo()
{
    return RPCHelpMan{"getrpcinfo",
                "\nReturns details of the RPC server.\n",
                {},
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::ARR, "active_commands", "All active commands",
                        {
                            {RPCResult::Type::OBJ, "", "Information about an active command",
                            {
                                 {RPCResult::Type::STR, "method", "The name of the RPC command"},
                                 {RPCResult::Type::NUM, "duration", "The running time in microseconds"},
                            }},
                        }},
                        {RPCResult::Type::STR, "logpath", "The complete file path to the debug log"},
                    }
                },
                RPCExamples{
                    HelpExampleCli("getrpcinfo", "")
                + HelpExampleRpc("getrpcinfo", "")},
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    LOCK(g_rpc_server_info.mutex);
    UniValue active_commands(UniValue::VARR);
    for (const RPCCommandExecutionInfo& info : g_rpc_server_info.active_commands) {
        UniValue entry(UniValue::VOBJ);
        entry.pushKV("method", info.method);
        entry.pushKV("duration", int64_t{Ticks<std::chrono::microseconds>(SteadyClock::now() - info.start)});
        active_commands.push_back(std::move(entry));
    }

    UniValue result(UniValue::VOBJ);
    result.pushKV("active_commands", std::move(active_commands));

    const std::string path = LogInstance().m_file_path.utf8string();
    UniValue log_path(UniValue::VSTR, path);
    result.pushKV("logpath", std::move(log_path));

    return result;
}
    };
}